

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O2

BinaryInstr<(flow::BinaryOperator)24,_(flow::LiteralType)1> * __thiscall
flow::IRBuilder::
insert<flow::BinaryInstr<(flow::BinaryOperator)24,(flow::LiteralType)1>,flow::Value*&,flow::Value*&,std::__cxx11::string>
          (IRBuilder *this,Value **args,Value **args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  BinaryInstr<(flow::BinaryOperator)24,_(flow::LiteralType)1> *pBVar1;
  Instr *local_20;
  _Head_base<0UL,_flow::Instr_*,_false> local_18;
  
  std::
  make_unique<flow::BinaryInstr<(flow::BinaryOperator)24,(flow::LiteralType)1>,flow::Value*,flow::Value*,std::__cxx11::string>
            ((Value **)&local_20,args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
  local_18._M_head_impl = local_20;
  local_20 = (Instr *)0x0;
  pBVar1 = (BinaryInstr<(flow::BinaryOperator)24,_(flow::LiteralType)1> *)
           insert(this,(unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)&local_18);
  if (local_18._M_head_impl != (Instr *)0x0) {
    (*((local_18._M_head_impl)->super_Value)._vptr_Value[1])();
  }
  if (local_20 != (Instr *)0x0) {
    (*(local_20->super_Value)._vptr_Value[1])();
  }
  return pBVar1;
}

Assistant:

T* insert(Args&&... args) {
    return static_cast<T*>(insert(std::make_unique<T>(std::move(args)...)));
  }